

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_256_paramSetA_cmovznz_u64
               (uint64_t *out1,fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 arg1,uint64_t arg2,
               uint64_t arg3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong in_RCX;
  ulong in_RDX;
  char in_SIL;
  ulong *in_RDI;
  uint64_t x3;
  uint64_t x2;
  fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x1;
  
  uVar1 = fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64((long)-(in_SIL != '\0'));
  uVar2 = fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64
                    ((long)-(in_SIL != '\0') ^ 0xffffffffffffffff);
  *in_RDI = uVar1 & in_RCX | uVar2 & in_RDX;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_cmovznz_u64(
    uint64_t *out1, fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 arg1,
    uint64_t arg2, uint64_t arg3) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_uint1 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = (!(!arg1));
    x2 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_int1)(0x0 - x1) &
          UINT64_C(0xffffffffffffffff));
    x3 = ((fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64(x2) &
           arg3) |
          (fiat_id_tc26_gost_3410_2012_256_paramSetA_value_barrier_u64((~x2)) &
           arg2));
    *out1 = x3;
}